

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Type.h
# Opt level: O0

int __thiscall Fl_Code_Type::handle_editor_changes(Fl_Code_Type *this)

{
  int iVar1;
  char *local_20;
  char *newcode;
  Fl_Code_Type *this_local;
  
  local_20 = (char *)0x0;
  newcode = (char *)this;
  iVar1 = ExternalCodeEditor::handle_changes(&this->editor_,&local_20,0);
  if (iVar1 == -1) {
    this_local._4_4_ = -1;
  }
  else if (iVar1 == 1) {
    Fl_Type::name(&this->super_Fl_Type,local_20);
    free(local_20);
    this_local._4_4_ = 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int handle_editor_changes() {
    const char *newcode = 0;
    switch ( editor_.handle_changes(&newcode) ) {
      case 1: {            // (1)=changed
        name(newcode);     // update value in ram
        free((void*)newcode);
        return 1;
      }
      case -1: return -1;  // (-1)=error -- couldn't read file (dialog showed reason)
      default: break;      // (0)=no change
    }
    return 0;
  }